

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O0

bool __thiscall Husky::ServerFrame::dispose(ServerFrame *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  ulong uVar5;
  long in_RDI;
  sockaddr_in dest;
  int sockfd;
  char *local_168;
  char *local_150;
  char *local_138;
  char *local_120;
  char *local_108;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  allocator local_31;
  string local_30 [47];
  bool local_1;
  
  *(undefined1 *)(in_RDI + 0x30) = 1;
  iVar1 = close(*(int *)(in_RDI + 0x38));
  if (iVar1 == -1) {
    pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      local_108 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
      ;
    }
    else {
      local_108 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                          ,0x2f);
      local_108 = local_108 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"error [%s]",&local_31);
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    Limonp::Logger::LoggingF(3,local_108,0x5f,(string *)local_30,pcVar3);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_1 = false;
  }
  else {
    iVar1 = socket(2,1,0);
    if (iVar1 < 0) {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                       ,0x2f);
      if (pcVar3 == (char *)0x0) {
        local_120 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
        ;
      }
      else {
        local_120 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                            ,0x2f);
        local_120 = local_120 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"error [%s]",&local_79);
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      Limonp::Logger::LoggingF(3,local_120,0x69,(string *)local_78,pcVar3);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      local_1 = false;
    }
    else {
      bzero(&stack0xffffffffffffffa8,0x10);
      htons(*(uint16_t *)(in_RDI + 0x32));
      iVar2 = inet_aton("127.0.0.1",(in_addr *)&stack0xffffffffffffffac);
      if (iVar2 == 0) {
        pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
        if (pcVar3 == (char *)0x0) {
          local_138 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
          ;
        }
        else {
          local_138 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                              ,0x2f);
          local_138 = local_138 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"error [%s]",&local_a1);
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        Limonp::Logger::LoggingF(3,local_138,0x72,(string *)local_a0,pcVar3);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        local_1 = false;
      }
      else {
        iVar2 = connect(iVar1,(sockaddr *)&stack0xffffffffffffffa8,0x10);
        if (iVar2 < 0) {
          pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                           ,0x2f);
          if (pcVar3 == (char *)0x0) {
            local_150 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
            ;
          }
          else {
            local_150 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                                ,0x2f);
            local_150 = local_150 + 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c8,"error [%s]",&local_c9);
          piVar4 = __errno_location();
          pcVar3 = strerror(*piVar4);
          Limonp::Logger::LoggingF(3,local_150,0x78,(string *)local_c8,pcVar3);
          std::__cxx11::string::~string(local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        }
        close(iVar1);
        uVar5 = (**(code **)(**(long **)(in_RDI + 0x40) + 0x18))();
        if ((uVar5 & 1) == 0) {
          pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                           ,0x2f);
          if (pcVar3 == (char *)0x0) {
            local_168 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
            ;
          }
          else {
            local_168 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                                ,0x2f);
            local_168 = local_168 + 1;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f0,"m_pHandler dispose failed.",&local_f1);
          Limonp::Logger::LoggingF(4,local_168,0x7d,(string *)local_f0);
          std::__cxx11::string::~string(local_f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        }
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

virtual bool dispose()    
            {
                m_bShutdown=true;
                if (SOCKET_ERROR==closesocket(m_lsnSock))
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }


                int sockfd;
                struct sockaddr_in dest;

                if ((sockfd = socket(AF_INET, SOCK_STREAM, 0)) < 0)
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }

                bzero(&dest, sizeof(dest));
                dest.sin_family = AF_INET;
                dest.sin_port = htons(m_nLsnPort);
                if (inet_aton("127.0.0.1", (struct in_addr *) &dest.sin_addr.s_addr) == 0)
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }

                if (connect(sockfd, (struct sockaddr *) &dest, sizeof(dest)) < 0)
                {
                    LogError("error [%s]", strerror(errno));
                }
                close(sockfd);
                if(!m_pHandler->dispose())
                {
                    LogFatal("m_pHandler dispose failed.");
                }
                return true;
            }